

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool __thiscall storage::BTInnerNode::search_node(BTInnerNode *this,int key,BTNode **out_record)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  iVar4 = (this->super_BTNode).used_links_count_;
  uVar3 = 0;
  if (1 < iVar4) {
    iVar4 = iVar4 + -1;
    do {
      iVar2 = (int)uVar3;
      iVar6 = iVar4 - iVar2 >> 1;
      iVar5 = iVar6 + iVar2;
      iVar1 = (this->super_BTNode).keys_[iVar5];
      uVar7 = iVar6 + iVar2 + 1;
      if (iVar1 == key) {
        uVar3 = (ulong)(int)uVar7;
        goto LAB_00103db6;
      }
      if (iVar1 <= key) {
        uVar3 = (ulong)uVar7;
        iVar5 = iVar4;
      }
      iVar4 = iVar5;
    } while ((int)uVar3 < iVar4);
    uVar3 = (ulong)(int)uVar3;
  }
LAB_00103db6:
  *out_record = this->links_[uVar3];
  return true;
}

Assistant:

bool BTInnerNode::search_node(int key, BTNode *&out_record) {
        int L = 0, R = used_links_count_ - 1;
        while (L < R) {
            int M = L + ((R - L) >> 1);   // avoid (L+R)/2 overflow
            if (keys_[M] == key) {
                out_record = links_[M + 1];
                return true;
            } else if (keys_[M] > key)
                R = M;
            else
                L = 1 + M;
        }
        out_record = links_[L];
        return true;
    }